

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O0

void __thiscall
icu_63::StringTrieBuilder::createCompactBuilder
          (StringTrieBuilder *this,int32_t sizeGuess,UErrorCode *errorCode)

{
  UBool UVar1;
  UHashtable *pUVar2;
  UErrorCode *errorCode_local;
  int32_t sizeGuess_local;
  StringTrieBuilder *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    pUVar2 = uhash_openSize_63(hashStringTrieNode,equalStringTrieNodes,(undefined1 *)0x0,sizeGuess,
                               errorCode);
    this->nodes = pUVar2;
    UVar1 = ::U_SUCCESS(*errorCode);
    if (UVar1 != '\0') {
      if (this->nodes == (UHashtable *)0x0) {
        *errorCode = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        uhash_setKeyDeleter_63(this->nodes,uprv_deleteUObject_63);
      }
    }
  }
  return;
}

Assistant:

void
StringTrieBuilder::createCompactBuilder(int32_t sizeGuess, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return;
    }
    nodes=uhash_openSize(hashStringTrieNode, equalStringTrieNodes, NULL,
                         sizeGuess, &errorCode);
    if(U_SUCCESS(errorCode)) {
        if(nodes==NULL) {
          errorCode=U_MEMORY_ALLOCATION_ERROR;
        } else {
          uhash_setKeyDeleter(nodes, uprv_deleteUObject);
        }
    }
}